

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::phase1ComputeDual(HEkkPrimal *this)

{
  double dVar1;
  uint uVar2;
  HEkk *pHVar3;
  HEkk *pHVar4;
  HighsInt iRow;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  HVector buffer;
  HVector bufferLong;
  HVectorBase<double> HStack_178;
  HVectorBase<double> local_c8;
  
  pHVar3 = this->ekk_instance_;
  HStack_178.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  HStack_178.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HStack_178.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  HStack_178.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  HStack_178.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  HStack_178.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  HStack_178.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  HStack_178.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  HStack_178.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  HStack_178.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  HStack_178.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  HStack_178.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  HStack_178.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  HStack_178.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  HStack_178.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  HStack_178.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  HStack_178.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  HStack_178.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HVectorBase<double>::setup(&HStack_178,this->num_row);
  HVectorBase<double>::clear(&HStack_178);
  HStack_178.count = 0;
  local_c8.size = 0;
  local_c8.count = 0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&(pHVar3->info_).workCost_,(long)this->num_tot,(value_type_conflict1 *)&local_c8);
  local_c8.size = 0;
  local_c8.count = 0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&(pHVar3->info_).workDual_,(long)this->num_tot,(value_type_conflict1 *)&local_c8);
  dVar9 = (pHVar3->info_).primal_simplex_phase1_cost_perturbation_multiplier * 5e-07;
  for (lVar5 = 0; uVar2 = this->num_row, lVar5 < (int)uVar2; lVar5 = lVar5 + 1) {
    dVar1 = (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5];
    dVar10 = -1.0;
    if ((dVar1 < (pHVar3->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar5] -
                 this->primal_feasibility_tolerance) ||
       (dVar10 = 1.0,
       this->primal_feasibility_tolerance +
       (pHVar3->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[lVar5] < dVar1)) {
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        dVar10 = dVar10 * ((pHVar3->info_).numTotRandomValue_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar5] * dVar9 + 1.0);
      }
      HStack_178.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5] = dVar10;
      lVar8 = (long)HStack_178.count;
      HStack_178.count = HStack_178.count + 1;
      HStack_178.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar8] = (int)lVar5;
    }
  }
  if (0 < HStack_178.count) {
    pHVar4 = this->ekk_instance_;
    uVar6 = 0;
    uVar7 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      (pHVar3->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start
      [(pHVar4->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[uVar6]] =
           HStack_178.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar6];
    }
    HEkk::fullBtran(this->ekk_instance_,&HStack_178);
    local_c8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_c8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_c8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_c8.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_c8.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_c8.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_c8.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_c8.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_c8.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_c8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_c8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_c8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    local_c8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    HVectorBase<double>::setup(&local_c8,this->num_col);
    HEkk::fullPrice(this->ekk_instance_,&HStack_178,&local_c8);
    uVar2 = this->num_col;
    lVar5 = (long)(int)uVar2;
    uVar7 = 0;
    uVar6 = 0;
    if (0 < (int)uVar2) {
      uVar6 = (ulong)uVar2;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      (pHVar3->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7] =
           (double)-(int)(pHVar3->basis_).nonbasicFlag_.
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar7] *
           local_c8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7];
    }
    uVar6 = 0;
    uVar7 = (ulong)(uint)this->num_row;
    if (this->num_row < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      (pHVar3->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5] =
           (double)-(int)(pHVar3->basis_).nonbasicFlag_.
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar5] *
           HStack_178.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar6];
      lVar5 = lVar5 + 1;
    }
    HVectorBase<double>::~HVectorBase(&local_c8);
  }
  HVectorBase<double>::~HVectorBase(&HStack_178);
  return;
}

Assistant:

void HEkkPrimal::phase1ComputeDual() {
  HighsSimplexInfo& info = ekk_instance_.info_;
  const vector<int8_t>& nonbasicFlag = ekk_instance_.basis_.nonbasicFlag_;

  HVector buffer;
  buffer.setup(num_row);
  buffer.clear();
  buffer.count = 0;
  // Accumulate costs for checking
  info.workCost_.assign(num_tot, 0);
  // Zero the dual values
  info.workDual_.assign(num_tot, 0);
  // Determine the base value for cost perturbation
  const double base =
      info.primal_simplex_phase1_cost_perturbation_multiplier * 5e-7;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    const double value = info.baseValue_[iRow];
    const double lower = info.baseLower_[iRow];
    const double upper = info.baseUpper_[iRow];
    HighsInt bound_violated = 0;
    if (value < lower - primal_feasibility_tolerance) {
      bound_violated = -1;
    } else if (value > upper + primal_feasibility_tolerance) {
      bound_violated = 1;
    }
    if (!bound_violated) continue;
    double cost = bound_violated;
    if (base) cost *= 1 + base * info.numTotRandomValue_[iRow];
    buffer.array[iRow] = cost;
    buffer.index[buffer.count++] = iRow;
  }
  if (buffer.count <= 0) {
    // Strange, should be a non-trivial RHS
    assert(buffer.count > 0);
    return;
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++)
    info.workCost_[ekk_instance_.basis_.basicIndex_[iRow]] = buffer.array[iRow];
  //
  // Full BTRAN
  //
  ekk_instance_.fullBtran(buffer);
  //
  // Full PRICE
  //
  HVector bufferLong;
  bufferLong.setup(num_col);
  ekk_instance_.fullPrice(buffer, bufferLong);

  for (HighsInt iCol = 0; iCol < num_col; iCol++)
    info.workDual_[iCol] = -nonbasicFlag[iCol] * bufferLong.array[iCol];
  for (HighsInt iRow = 0, iCol = num_col; iRow < num_row; iRow++, iCol++)
    info.workDual_[iCol] = -nonbasicFlag[iCol] * buffer.array[iRow];
}